

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

void clean_mob_class(MOB_INDEX_DATA *pMob,int class_index)

{
  CClass *pCVar1;
  
  if ((uint)class_index < 2) {
    pMob->ele_major = 0;
    pMob->ele_para = 0;
  }
  if ((class_index == 0xb) || (class_index == 0)) {
    zero_vector(pMob->styles);
  }
  pCVar1 = CClass::GetClass(class_index);
  pMob->my_class = pCVar1;
  return;
}

Assistant:

void clean_mob_class(MOB_INDEX_DATA *pMob, int class_index)
{
	if (class_index == CLASS_WARRIOR || class_index == CLASS_NONE)
	{
		pMob->ele_major = 0;
		pMob->ele_para = 0;
	}

	if (class_index == CLASS_SORCERER || class_index == CLASS_NONE)
	{
		zero_vector(pMob->styles);
	}

	pMob->SetClass(class_index);
}